

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  byte *pbVar1;
  Fts3PhraseToken *pFVar2;
  byte *pbVar3;
  Fts3MultiSegReader *pCsr_00;
  sqlite3_stmt *pStmt_00;
  int iVar4;
  uint uVar5;
  Mem *pVal;
  char *pBuf;
  ulong uVar6;
  Fts3DeferredToken *pFVar7;
  long lVar8;
  Fts3TokenAndCost *pFVar9;
  int iVar10;
  byte *pbVar11;
  char *pBuf_00;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  Fts3TokenAndCost *pFVar17;
  bool bVar18;
  sqlite3_int64 nDoc;
  Fts3Table *p;
  sqlite3_stmt *pStmt;
  sqlite3_int64 nByte;
  ulong local_90;
  Fts3Cursor *local_88;
  Fts3TokenAndCost *local_80;
  ulong local_78;
  Fts3Table *local_70;
  sqlite3_stmt *local_68;
  ulong local_60;
  int local_58;
  uint local_54;
  ulong local_50;
  sqlite_int64 local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = (Fts3Table *)(pCsr->base).pVtab;
  if (local_70->zContentTbl != (char *)0x0) {
    return 0;
  }
  if (nTC < 1) {
    bVar18 = true;
    local_78 = 0;
  }
  else {
    lVar8 = 0;
    local_78 = 0;
    iVar10 = 0;
    do {
      if (*(Fts3Expr **)((long)&aTC->pRoot + lVar8) == pRoot) {
        iVar10 = iVar10 + *(int *)((long)&aTC->nOvfl + lVar8);
        local_78 = (ulong)((int)local_78 + 1);
      }
      lVar8 = lVar8 + 0x28;
    } while ((ulong)(uint)nTC * 0x28 != lVar8);
    bVar18 = iVar10 == 0;
  }
  if ((bool)((int)local_78 < 2 | bVar18)) {
    return 0;
  }
  iVar10 = 0;
  local_88 = pCsr;
  if (pCsr->nRowAvg == 0) {
    local_90 = 0;
    local_50 = 0;
    local_48 = 0;
    iVar10 = sqlite3Fts3SelectDoctotal(local_70,&local_68);
    pStmt_00 = local_68;
    if (iVar10 == 0) {
      pVal = columnMem(local_68,0);
      pBuf = (char *)sqlite3_value_blob(pVal);
      columnMallocFailure(pStmt_00);
      uVar16 = sqlite3_column_bytes(pStmt_00,0);
      pBuf_00 = (char *)(ulong)uVar16;
      iVar10 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&local_90);
      if (iVar10 < (int)uVar16) {
        pBuf_00 = pBuf + iVar10;
        do {
          iVar10 = sqlite3Fts3GetVarint(pBuf_00,&local_48);
          pBuf_00 = pBuf_00 + iVar10;
        } while (pBuf_00 < pBuf + (int)uVar16);
      }
      iVar4 = (int)pBuf_00;
      bVar18 = local_48 != 0 && local_90 != 0;
      if (bVar18) {
        local_88->nDoc = local_90;
        local_88->nRowAvg =
             (int)((local_48 / (long)local_90 + (long)local_70->nPgsz) / (long)local_70->nPgsz);
        iVar10 = sqlite3_reset(pStmt_00);
      }
      else {
        sqlite3_reset(pStmt_00);
        iVar4 = 0x10b;
        iVar10 = 0;
      }
    }
    else {
      bVar18 = false;
      iVar4 = iVar10;
    }
    if (!bVar18) goto LAB_001bd4ee;
  }
  local_50 = (ulong)(uint)local_88->nRowAvg;
  iVar4 = iVar10;
LAB_001bd4ee:
  if ((0 < (int)local_78) && (iVar4 == 0)) {
    local_54 = (int)local_78 - 1;
    local_38 = (ulong)(uint)nTC;
    uVar15 = 1;
    uVar16 = 0;
    local_60 = 0;
    uVar14 = local_78;
    local_80 = aTC;
    local_58 = nTC;
    do {
      if (nTC < 1) {
        pFVar17 = (Fts3TokenAndCost *)0x0;
      }
      else {
        pFVar17 = (Fts3TokenAndCost *)0x0;
        uVar6 = local_38;
        pFVar9 = aTC;
        do {
          if (((pFVar9->pToken != (Fts3PhraseToken *)0x0) && (pFVar9->pRoot == pRoot)) &&
             ((pFVar17 == (Fts3TokenAndCost *)0x0 || (pFVar9->nOvfl < pFVar17->nOvfl)))) {
            pFVar17 = pFVar9;
          }
          pFVar9 = pFVar9 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      iVar10 = (int)uVar15;
      if (uVar16 == 0) {
LAB_001bd597:
        uVar15 = uVar15 & 0xffffffff;
        if (uVar16 < 0xc) {
          uVar15 = (ulong)(uint)(iVar10 * 4);
        }
        if ((uVar16 == 0) || ((iVar4 = 0, 1 < pFVar17->pPhrase->nToken && (uVar16 != local_54)))) {
          local_90 = local_90 & 0xffffffff00000000;
          local_68 = (sqlite3_stmt *)0x0;
          iVar4 = fts3TermSelect(local_70,pFVar17->pToken,pFVar17->iCol,(int *)&local_90,
                                 (char **)&local_68);
          if (iVar4 == 0) {
            iVar4 = fts3EvalPhraseMergeToken
                              (local_70,pFVar17->pPhrase,pFVar17->iToken,(char *)local_68,
                               (int)local_90);
          }
          aTC = local_80;
          uVar14 = local_78;
          if (iVar4 == 0) {
            pbVar3 = (byte *)(pFVar17->pPhrase->doclist).aAll;
            uVar5 = 0;
            if ((pbVar3 != (byte *)0x0) &&
               (lVar8 = (long)(pFVar17->pPhrase->doclist).nAll, uVar5 = 0, 0 < lVar8)) {
              uVar5 = 0;
              pbVar1 = pbVar3;
              do {
                do {
                  pbVar11 = pbVar1;
                  pbVar1 = pbVar11 + 1;
                } while ((char)*pbVar11 < '\0');
                bVar12 = pbVar11[1];
                if (bVar12 != 0) {
                  do {
                    pbVar1 = pbVar11 + 2;
                    bVar13 = bVar12 & 0x80;
                    pbVar11 = pbVar11 + 1;
                    bVar12 = *pbVar1;
                  } while (bVar13 != 0 || *pbVar1 != 0);
                }
                uVar5 = uVar5 + 1;
                pbVar1 = pbVar11 + 2;
              } while (pbVar11 + 2 < pbVar3 + lVar8);
            }
            iVar10 = (int)local_60;
            local_60 = local_60 & 0xffffffff;
            if ((int)uVar5 < iVar10) {
              local_60 = (ulong)uVar5;
            }
            if (uVar16 == 0) {
              local_60 = (ulong)uVar5;
            }
          }
        }
      }
      else {
        iVar4 = iVar10 + 3;
        if (-1 < iVar10) {
          iVar4 = iVar10;
        }
        if (pFVar17->nOvfl < (((int)local_60 + (iVar4 >> 2) + -1) / (iVar4 >> 2)) * (int)local_50)
        goto LAB_001bd597;
        pFVar2 = pFVar17->pToken;
        iVar10 = pFVar17->iCol;
        local_40 = uVar15;
        iVar4 = sqlite3_initialize();
        if (iVar4 == 0) {
          pFVar7 = (Fts3DeferredToken *)sqlite3Malloc(0x20);
        }
        else {
          pFVar7 = (Fts3DeferredToken *)0x0;
        }
        if (pFVar7 == (Fts3DeferredToken *)0x0) {
          iVar4 = 7;
        }
        else {
          pFVar7->pToken = (Fts3PhraseToken *)0x0;
          *(undefined8 *)&pFVar7->iCol = 0;
          pFVar7->pNext = (Fts3DeferredToken *)0x0;
          pFVar7->pList = (PendingList *)0x0;
          pFVar7->pToken = pFVar2;
          pFVar7->pNext = local_88->pDeferred;
          pFVar7->iCol = iVar10;
          local_88->pDeferred = pFVar7;
          pFVar2->pDeferred = pFVar7;
          iVar4 = 0;
        }
        pCsr_00 = pFVar2->pSegcsr;
        sqlite3Fts3SegReaderFinish(pCsr_00);
        sqlite3_free(pCsr_00);
        pFVar2->pSegcsr = (Fts3MultiSegReader *)0x0;
        aTC = local_80;
        uVar14 = local_78;
        uVar15 = local_40;
        nTC = local_58;
      }
      pFVar17->pToken = (Fts3PhraseToken *)0x0;
      uVar16 = uVar16 + 1;
    } while (((int)uVar16 < (int)uVar14) && (iVar4 == 0));
  }
  return iVar4;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order 
  ** of the number of overflow pages that will be loaded by the pager layer 
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in 
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot 
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl) 
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages 
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from 
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}